

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_e7b893::HandleSublistCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  cmMakefile *this;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  string *name;
  string_view separator;
  string_view value;
  string local_d0;
  int length;
  int start;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  cmAlphaNum local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sublist;
  unsigned_long local_28;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pbVar2 - (long)pbVar1;
  if (lVar4 != 0xa0) {
    local_88.View_._M_len = 0x2d;
    local_88.View_._M_str = "sub-command SUBLIST requires four arguments (";
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&sublist,(lVar4 >> 5) - 1);
    cmStrCat<char[9]>(&local_d0,&local_88,(cmAlphaNum *)&sublist,(char (*) [9])" found).");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_d0);
    return false;
  }
  varArgsExpanded.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  varArgsExpanded.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  varArgsExpanded.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = GetList(&varArgsExpanded,pbVar1 + 1,status->Makefile);
  name = pbVar2 + -1;
  if ((bVar3) &&
     (varArgsExpanded.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      varArgsExpanded.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    bVar3 = GetIndexArg((args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 2,&start,status->Makefile);
    if (bVar3) {
      bVar3 = GetIndexArg((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 3,&length,status->Makefile);
      if (bVar3) {
        uVar6 = (ulong)start;
        if (((long)uVar6 < 0) ||
           (uVar7 = (long)varArgsExpanded.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)varArgsExpanded.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5, uVar7 <= uVar6)) {
          local_88.View_._M_len = 0xd;
          local_88.View_._M_str = "begin index: ";
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)&sublist,start);
          local_28 = ((long)varArgsExpanded.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)varArgsExpanded.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
          cmStrCat<char[22],unsigned_long>
                    (&local_d0,&local_88,(cmAlphaNum *)&sublist,
                     (char (*) [22])" is out of range 0 - ",&local_28);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        else {
          if (-2 < length) {
            uVar5 = (ulong)(uint)(length + start);
            if (uVar7 < (uint)(length + start)) {
              uVar5 = uVar7;
            }
            if (length == -1) {
              uVar5 = uVar7;
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&sublist
                       ,varArgsExpanded.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar6,
                       varArgsExpanded.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar5,(allocator_type *)&local_88
                      );
            this = status->Makefile;
            separator._M_str = ";";
            separator._M_len = 1;
            cmJoin((string *)&local_88,&sublist,separator,(string_view)ZEXT816(0));
            value._M_str = (char *)local_88.View_._M_len;
            value._M_len = (size_t)local_88.View_._M_str;
            cmMakefile::AddDefinition(this,name,value);
            std::__cxx11::string::~string((string *)&local_88);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&sublist);
            bVar3 = true;
            goto LAB_0030e5af;
          }
          local_88.View_._M_len = 8;
          local_88.View_._M_str = "length: ";
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)&sublist,length);
          cmStrCat<char[25]>(&local_d0,&local_88,(cmAlphaNum *)&sublist,
                             (char (*) [25])" should be -1 or greater");
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
      }
      else {
        local_88.View_._M_len = 7;
        local_88.View_._M_str = "index: ";
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        sublist.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)pbVar1[3]._M_dataplus._M_p;
        sublist.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pbVar1[3]._M_string_length;
        cmStrCat<char[22]>(&local_d0,&local_88,(cmAlphaNum *)&sublist,
                           (char (*) [22])" is not a valid index");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
    else {
      local_88.View_._M_len = 7;
      local_88.View_._M_str = "index: ";
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      sublist.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)pbVar1[2]._M_dataplus._M_p;
      sublist.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pbVar1[2]._M_string_length;
      cmStrCat<char[22]>(&local_d0,&local_88,(cmAlphaNum *)&sublist,
                         (char (*) [22])" is not a valid index");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    std::__cxx11::string::~string((string *)&local_d0);
    bVar3 = false;
  }
  else {
    bVar3 = true;
    cmMakefile::AddDefinition(status->Makefile,name,(string_view)(ZEXT816(0x67e599) << 0x40));
  }
LAB_0030e5af:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&varArgsExpanded);
  return bVar3;
}

Assistant:

bool HandleSublistCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() != 5) {
    status.SetError(cmStrCat("sub-command SUBLIST requires four arguments (",
                             args.size() - 1, " found)."));
    return false;
  }

  const std::string& listName = args[1];
  const std::string& variableName = args.back();

  // expand the variable
  std::vector<std::string> varArgsExpanded;
  if (!GetList(varArgsExpanded, listName, status.GetMakefile()) ||
      varArgsExpanded.empty()) {
    status.GetMakefile().AddDefinition(variableName, "");
    return true;
  }

  int start;
  int length;
  if (!GetIndexArg(args[2], &start, status.GetMakefile())) {
    status.SetError(cmStrCat("index: ", args[2], " is not a valid index"));
    return false;
  }
  if (!GetIndexArg(args[3], &length, status.GetMakefile())) {
    status.SetError(cmStrCat("index: ", args[3], " is not a valid index"));
    return false;
  }

  using size_type = decltype(varArgsExpanded)::size_type;

  if (start < 0 || static_cast<size_type>(start) >= varArgsExpanded.size()) {
    status.SetError(cmStrCat("begin index: ", start, " is out of range 0 - ",
                             varArgsExpanded.size() - 1));
    return false;
  }
  if (length < -1) {
    status.SetError(cmStrCat("length: ", length, " should be -1 or greater"));
    return false;
  }

  const size_type end =
    (length == -1 ||
     static_cast<size_type>(start + length) > varArgsExpanded.size())
    ? varArgsExpanded.size()
    : static_cast<size_type>(start + length);
  std::vector<std::string> sublist(varArgsExpanded.begin() + start,
                                   varArgsExpanded.begin() + end);
  status.GetMakefile().AddDefinition(variableName, cmJoin(sublist, ";"));
  return true;
}